

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

DirHandle * createDirHandle(PHYSFS_Io *io,char *newDir,char *mountPoint,int forWriting)

{
  ulong uVar1;
  PHYSFS_Archiver *pPVar2;
  _func_void_PHYSFS_Io_ptr *p_Var3;
  void *pvVar4;
  _func_void_void_ptr *p_Var5;
  undefined8 uVar6;
  _func_void_ptr_PHYSFS_uint64 *p_Var7;
  int iVar8;
  PHYSFS_ErrorCode errcode;
  size_t sVar9;
  char *dst;
  char *pcVar10;
  DirHandle *pDVar11;
  PHYSFS_Io *io_00;
  char *pcVar12;
  undefined1 *puVar13;
  undefined1 *ptr;
  PHYSFS_Archiver **ppPVar14;
  PHYSFS_Archiver **ppPVar15;
  bool bVar16;
  undefined1 auStack_78 [8];
  undefined1 local_70 [8];
  PHYSFS_Stat statbuf;
  int local_34 [2];
  int claimed;
  
  puVar13 = auStack_78;
  if (mountPoint == (char *)0x0) {
    dst = (char *)0x0;
LAB_0010770c:
    local_34[0] = 0;
    io_00 = io;
    if (io == (PHYSFS_Io *)0x0) {
      *(undefined8 *)(puVar13 + -8) = 1;
      uVar6 = *(undefined8 *)(puVar13 + -8);
      *(undefined8 *)(puVar13 + -8) = 0x10782d;
      iVar8 = __PHYSFS_platformStat(newDir,(PHYSFS_Stat *)local_70,(int)uVar6);
      if (iVar8 == 0) goto LAB_001079c9;
      if ((int)statbuf.accesstime != 1) {
LAB_0010786f:
        *(undefined8 *)(puVar13 + -8) = 0x107889;
        io_00 = __PHYSFS_createNativeIo(newDir,(uint)(forWriting != 0) * 5 + 0x72);
        if (io_00 == (PHYSFS_Io *)0x0) goto LAB_001079c9;
        goto LAB_0010771c;
      }
      *(undefined8 *)(puVar13 + -8) = 0x107859;
      pDVar11 = tryOpenDir((PHYSFS_Io *)0x0,&__PHYSFS_Archiver_DIR,newDir,forWriting,local_34);
      if ((pDVar11 == (DirHandle *)0x0) && (local_34[0] == 0)) goto LAB_0010786f;
      if (pDVar11 == (DirHandle *)0x0) goto LAB_001079c9;
LAB_001078f7:
      p_Var7 = __PHYSFS_AllocatorHooks.Malloc;
      *(undefined8 *)(puVar13 + -8) = 0x107906;
      sVar9 = strlen(newDir);
      *(undefined8 *)(puVar13 + -8) = 0x10790c;
      pcVar12 = (char *)(*p_Var7)(sVar9 + 1);
      pDVar11->dirName = pcVar12;
      if (pcVar12 != (char *)0x0) {
        *(undefined8 *)(puVar13 + -8) = 0x107924;
        strcpy(pcVar12,newDir);
        p_Var7 = __PHYSFS_AllocatorHooks.Malloc;
        if ((dst == (char *)0x0) || (*dst == '\0')) goto LAB_001079cc;
        *(undefined8 *)(puVar13 + -8) = 0x107946;
        sVar9 = strlen(dst);
        *(undefined8 *)(puVar13 + -8) = 0x10794c;
        pcVar12 = (char *)(*p_Var7)(sVar9 + 2);
        pDVar11->mountPoint = pcVar12;
        if (pcVar12 != (char *)0x0) {
          *(undefined8 *)(puVar13 + -8) = 0x107960;
          strcpy(pcVar12,dst);
          pcVar12 = pDVar11->mountPoint;
          *(undefined8 *)(puVar13 + -8) = 0x10796c;
          sVar9 = strlen(pcVar12);
          pcVar12 = pcVar12 + sVar9;
          pcVar12[0] = '/';
          pcVar12[1] = '\0';
          goto LAB_001079cc;
        }
      }
      *(undefined8 *)(puVar13 + -8) = 2;
      uVar6 = *(undefined8 *)(puVar13 + -8);
      *(undefined8 *)(puVar13 + -8) = 0x1079a1;
      PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar6);
      pvVar4 = pDVar11->opaque;
      p_Var5 = pDVar11->funcs->closeArchive;
      *(undefined8 *)(puVar13 + -8) = 0x1079ac;
      (*p_Var5)(pvVar4);
      pcVar12 = pDVar11->dirName;
      *(undefined8 *)(puVar13 + -8) = 0x1079b6;
      (*__PHYSFS_AllocatorHooks.Free)(pcVar12);
      pcVar12 = pDVar11->mountPoint;
      *(undefined8 *)(puVar13 + -8) = 0x1079c0;
      (*__PHYSFS_AllocatorHooks.Free)(pcVar12);
      *(undefined8 *)(puVar13 + -8) = 0x1079c9;
      (*__PHYSFS_AllocatorHooks.Free)(pDVar11);
    }
    else {
LAB_0010771c:
      statbuf._32_8_ = io;
      *(undefined8 *)(puVar13 + -8) = 0x2e;
      uVar6 = *(undefined8 *)(puVar13 + -8);
      *(undefined8 *)(puVar13 + -8) = 0x107730;
      pcVar10 = strchr(newDir,(int)uVar6);
      pcVar12 = pcVar10;
      while (pcVar10 != (char *)0x0) {
        *(undefined8 *)(puVar13 + -8) = 0x107745;
        pcVar10 = strchr(pcVar10 + 1,(int)uVar6);
        if (pcVar10 != (char *)0x0) {
          pcVar12 = pcVar10;
        }
      }
      if (pcVar12 == (char *)0x0) {
        pDVar11 = (DirHandle *)0x0;
        ppPVar14 = archivers;
        while (((pPVar2 = *ppPVar14, pPVar2 != (PHYSFS_Archiver *)0x0 &&
                (pDVar11 == (DirHandle *)0x0)) && (local_34[0] == 0))) {
          *(undefined8 *)(puVar13 + -8) = 0x1078c8;
          pDVar11 = tryOpenDir(io_00,pPVar2,newDir,forWriting,local_34);
          ppPVar14 = ppPVar14 + 1;
        }
      }
      else {
        pDVar11 = (DirHandle *)0x0;
        ppPVar14 = archivers;
        while (((ppPVar15 = archivers, *ppPVar14 != (PHYSFS_Archiver *)0x0 &&
                (pDVar11 == (DirHandle *)0x0)) && (local_34[0] == 0))) {
          pcVar10 = ((*ppPVar14)->info).extension;
          *(undefined8 *)(puVar13 + -8) = 0x10778d;
          iVar8 = PHYSFS_utf8stricmp(pcVar12 + 1,pcVar10);
          if (iVar8 == 0) {
            pPVar2 = *ppPVar14;
            *(undefined8 *)(puVar13 + -8) = 0x1077ab;
            pDVar11 = tryOpenDir(io_00,pPVar2,newDir,forWriting,local_34);
          }
          else {
            pDVar11 = (DirHandle *)0x0;
          }
          ppPVar14 = ppPVar14 + 1;
        }
        while (((*ppPVar15 != (PHYSFS_Archiver *)0x0 && (pDVar11 == (DirHandle *)0x0)) &&
               (local_34[0] == 0))) {
          pcVar10 = ((*ppPVar15)->info).extension;
          *(undefined8 *)(puVar13 + -8) = 0x1077e4;
          iVar8 = PHYSFS_utf8stricmp(pcVar12 + 1,pcVar10);
          if (iVar8 == 0) {
            pDVar11 = (DirHandle *)0x0;
          }
          else {
            pPVar2 = *ppPVar15;
            *(undefined8 *)(puVar13 + -8) = 0x1077fd;
            pDVar11 = tryOpenDir(io_00,pPVar2,newDir,forWriting,local_34);
          }
          ppPVar15 = ppPVar15 + 1;
        }
      }
      *(undefined8 *)(puVar13 + -8) = 0x1078d6;
      errcode = currentErrorCode();
      uVar1 = statbuf._32_8_ | (ulong)pDVar11;
      statbuf.filetype = (int)uVar1;
      statbuf.readonly = (int)(uVar1 >> 0x20);
      if (uVar1 == 0) {
        p_Var3 = io_00->destroy;
        *(undefined8 *)(puVar13 + -8) = 0x1078e5;
        (*p_Var3)(io_00);
      }
      else if (pDVar11 != (DirHandle *)0x0) goto LAB_001078f7;
      if (errcode != PHYSFS_ERR_OK || local_34[0] == 0) {
        bVar16 = local_34[0] == 0;
        *(undefined8 *)(puVar13 + -8) = 6;
        if (bVar16) {
          errcode = (PHYSFS_ErrorCode)*(undefined8 *)(puVar13 + -8);
        }
        *(undefined8 *)(puVar13 + -8) = 0x107997;
        PHYSFS_setErrorCode(errcode);
      }
    }
  }
  else {
    sVar9 = strlen(mountPoint);
    if (sVar9 + 1 < 0x100) {
      ptr = auStack_78 + -(sVar9 + 0x18 & 0xfffffffffffffff0);
      puVar13 = ptr;
    }
    else {
      ptr = (undefined1 *)0x0;
      puVar13 = auStack_78;
    }
    *(undefined8 *)(puVar13 + -8) = 0x1076ed;
    dst = (char *)__PHYSFS_initSmallAlloc(ptr,sVar9 + 1);
    if (dst == (char *)0x0) {
      *(undefined8 *)(puVar13 + -8) = 2;
      uVar6 = *(undefined8 *)(puVar13 + -8);
      *(undefined8 *)(puVar13 + -8) = 0x107816;
      PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar6);
      dst = (char *)0x0;
    }
    else {
      *(undefined8 *)(puVar13 + -8) = 0x107704;
      iVar8 = sanitizePlatformIndependentPath(mountPoint,dst);
      if (iVar8 != 0) goto LAB_0010770c;
    }
  }
LAB_001079c9:
  pDVar11 = (DirHandle *)0x0;
LAB_001079cc:
  *(undefined8 *)(puVar13 + -8) = 0x1079d4;
  __PHYSFS_smallFree(dst);
  return pDVar11;
}

Assistant:

static DirHandle *createDirHandle(PHYSFS_Io *io, const char *newDir,
                                  const char *mountPoint, int forWriting)
{
    DirHandle *dirHandle = NULL;
    char *tmpmntpnt = NULL;

    assert(newDir != NULL);  /* should have caught this higher up. */

    if (mountPoint != NULL)
    {
        const size_t len = strlen(mountPoint) + 1;
        tmpmntpnt = (char *) __PHYSFS_smallAlloc(len);
        GOTO_IF(!tmpmntpnt, PHYSFS_ERR_OUT_OF_MEMORY, badDirHandle);
        if (!sanitizePlatformIndependentPath(mountPoint, tmpmntpnt))
            goto badDirHandle;
        mountPoint = tmpmntpnt;  /* sanitized version. */
    } /* if */

    dirHandle = openDirectory(io, newDir, forWriting);
    GOTO_IF_ERRPASS(!dirHandle, badDirHandle);

    dirHandle->dirName = (char *) allocator.Malloc(strlen(newDir) + 1);
    GOTO_IF(!dirHandle->dirName, PHYSFS_ERR_OUT_OF_MEMORY, badDirHandle);
    strcpy(dirHandle->dirName, newDir);

    if ((mountPoint != NULL) && (*mountPoint != '\0'))
    {
        dirHandle->mountPoint = (char *)allocator.Malloc(strlen(mountPoint)+2);
        if (!dirHandle->mountPoint)
            GOTO(PHYSFS_ERR_OUT_OF_MEMORY, badDirHandle);
        strcpy(dirHandle->mountPoint, mountPoint);
        strcat(dirHandle->mountPoint, "/");
    } /* if */

    __PHYSFS_smallFree(tmpmntpnt);
    return dirHandle;

badDirHandle:
    if (dirHandle != NULL)
    {
        dirHandle->funcs->closeArchive(dirHandle->opaque);
        allocator.Free(dirHandle->dirName);
        allocator.Free(dirHandle->mountPoint);
        allocator.Free(dirHandle);
    } /* if */

    __PHYSFS_smallFree(tmpmntpnt);
    return NULL;
}